

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O1

void __thiscall cfd::core::ConfidentialTxIn::~ConfidentialTxIn(ConfidentialTxIn *this)

{
  ~ConfidentialTxIn(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ConfidentialTxIn() {
    // do nothing
  }